

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDLNodeTest.cpp
# Opt level: O3

void __thiscall
ODDLParser::DDLNodeTest_accessParentTest_Test::~DDLNodeTest_accessParentTest_Test
          (DDLNodeTest_accessParentTest_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(DDLNodeTest, accessParentTest) {
    static const std::string parent = "test";
    static const std::string parentName = "testparent_name";
    DDLNode *parentNode = DDLNode::create(parent, "parentName");
    static const std::string name1 = "test1";
    static const std::string childType = "child";
    DDLNode *myNode = DDLNode::create(childType, name1, parentNode);
    EXPECT_EQ(parentNode, myNode->getParent());
    EXPECT_EQ(1U, parentNode->getChildNodeList().size());

    DDLNode *myNodeWithoutParent = DDLNode::create(childType, name1);
    EXPECT_EQ(nullptr, myNodeWithoutParent->getParent());

    myNodeWithoutParent->attachParent(parentNode);
    EXPECT_EQ(parentNode, myNodeWithoutParent->getParent());
    DDLNode::DllNodeList myChilds = parentNode->getChildNodeList();
    EXPECT_EQ(2U, myChilds.size());

    // check if the child node is not the parent node ( bug )
    EXPECT_EQ(name1, myChilds[0]->getName());
    EXPECT_EQ(name1, myChilds[1]->getName());

    delete parentNode;
}